

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsCpp.cpp
# Opt level: O1

int gdsRecordToText(char *recIn)

{
  long lVar1;
  int iVar2;
  ostream *poVar3;
  long *plVar4;
  long *plVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  char *pcVar9;
  ulong uVar10;
  uint32_t GDSKey;
  vector<double,_std::allocator<double>_> B8Real;
  vector<int,_std::allocator<int>_> integer;
  string words;
  string keyName;
  bitset<8UL> bitsIn1;
  bitset<8UL> bitsIn0;
  bitset<16UL> bitarr;
  uint local_12c;
  vector<double,_std::allocator<double>_> local_128;
  vector<int,_std::allocator<int>_> local_108;
  string local_e8;
  string local_c8;
  long *local_a8;
  long local_a0;
  long local_98;
  long lStack_90;
  char *local_88;
  long local_80;
  char local_78;
  undefined7 uStack_77;
  ulong local_68;
  ulong local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  bitset<16UL> local_38;
  
  local_38.super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)0;
  local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  local_c8._M_string_length = 0;
  local_c8.field_2._M_local_buf[0] = '\0';
  local_80 = 0;
  local_78 = '\0';
  local_88 = &local_78;
  iVar2 = GDSdistill(recIn,&local_12c,&local_38,&local_108,&local_128,&local_c8);
  iVar7 = 1;
  if (iVar2 == 1) goto LAB_00108afd;
  GDSkey2ASCII_abi_cxx11_(&local_e8,local_12c);
  std::__cxx11::string::operator=((string *)&local_88,(string *)&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  iVar2 = std::__cxx11::string::compare((char *)&local_88);
  if (iVar2 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Key not found: 0x",0x11);
    *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    lVar6 = *(long *)poVar3;
    lVar1 = *(long *)(lVar6 + -0x18);
    *(uint *)(poVar3 + lVar1 + 0x18) = *(uint *)(poVar3 + lVar1 + 0x18) & 0xffffffb5 | 2;
    std::ios::widen((char)*(undefined8 *)(lVar6 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    goto LAB_00108afd;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[",1);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_88,local_80);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"]",1);
  if ((char)local_12c == '\0') {
LAB_001088cd:
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
    std::ostream::put(-0x70);
    std::ostream::flush();
  }
  else if ((local_12c & 0xff) == 1) {
    local_60 = (ulong)(byte)recIn[4];
    local_68 = (ulong)(byte)recIn[5];
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":{",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"0b",2);
    std::bitset<8ul>::to_string<char,std::char_traits<char>,std::allocator<char>>
              (&local_e8,(bitset<8ul> *)&local_60);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_e8._M_dataplus._M_p,local_e8._M_string_length);
    std::bitset<8ul>::to_string<char,std::char_traits<char>,std::allocator<char>>
              (&local_58,(bitset<8ul> *)&local_68);
    plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,0x11764d);
    plVar5 = plVar4 + 2;
    if ((long *)*plVar4 == plVar5) {
      local_98 = *plVar5;
      lStack_90 = plVar4[3];
      local_a8 = &local_98;
    }
    else {
      local_98 = *plVar5;
      local_a8 = (long *)*plVar4;
    }
    local_a0 = plVar4[1];
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_a8,local_a0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"}",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    if (local_a8 != &local_98) {
      operator_delete(local_a8,local_98 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    if ((local_12c & 0xfe) == 2) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":{",2);
      if (local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish !=
          local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start) {
        uVar8 = 1;
        uVar10 = 0;
        do {
          std::ostream::operator<<
                    ((ostream *)&std::cout,
                     local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar10]);
          if (uVar10 < ((long)local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start >> 2) - 1U) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
          }
          uVar10 = (ulong)uVar8;
          uVar8 = uVar8 + 1;
        } while (uVar10 < (ulong)((long)local_108.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_108.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start >> 2));
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"}",1);
      goto LAB_001088cd;
    }
    if ((char)local_12c == '\x04') {
      lVar6 = 0x21;
      pcVar9 = "Unsupported 4 byte real variable.";
LAB_00108b90:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar9,lVar6);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      goto LAB_00108afd;
    }
    if ((local_12c & 0xff) == 6) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":{",2);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_c8._M_dataplus._M_p,local_c8._M_string_length)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"}",1);
    }
    else {
      if ((local_12c & 0xff) != 5) {
        lVar6 = 0xf;
        pcVar9 = "Smoke detected.";
        goto LAB_00108b90;
      }
      poVar3 = (ostream *)&std::cout;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":{",2);
      *(undefined8 *)(operator_delete__ + *(long *)(std::cout + -0x18)) = 0xc;
      if (local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar8 = 1;
        uVar10 = 0;
        do {
          std::ostream::_M_insert<double>
                    (local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar10]);
          if (uVar10 < ((long)local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start >> 3) - 1U) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
          }
          uVar10 = (ulong)uVar8;
          uVar8 = uVar8 + 1;
        } while (uVar10 < (ulong)((long)local_128.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_finish -
                                  (long)local_128.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start >> 3));
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"}",1);
    }
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  iVar7 = 0;
LAB_00108afd:
  if (local_88 != &local_78) {
    operator_delete(local_88,CONCAT71(uStack_77,local_78) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,
                    CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                             local_c8.field_2._M_local_buf[0]) + 1);
  }
  if (local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return iVar7;
}

Assistant:

int gdsRecordToText(char *recIn)
{
  uint32_t GDSKey;
  bitset<16> bitarr;
  vector<int> integer;
  vector<double> B8Real;
  string words;
  string keyName;

  uint8_t dataType;

  if (GDSdistill(recIn, GDSKey, bitarr, integer, B8Real, words) == 1) {
    return 1;
  }
  dataType = GDSKey;

  keyName = GDSkey2ASCII(GDSKey);

  if (!keyName.compare("\0")) {
    cout << "Key not found: 0x" << hex << GDSKey << dec << endl;
    return 1;
  }

  cout << "[" << keyName << "]";

  if (dataType == 0) {
    // no data
    cout << endl;
  } else if (dataType == 1) {
    // bit array
    int i = 4;
    bitset<8> bitsIn0(recIn[i++]);
    bitset<8> bitsIn1(recIn[i]);

    cout << ":{"
         << "0b" << bitsIn0.to_string() << " 0b" + bitsIn1.to_string() << "}"
         << endl;
  } else if (dataType == 2 || dataType == 3) {
    // signed integers

    cout << ":{";
    for (unsigned int j = 0; j < integer.size(); j++) {
      cout << integer[j];
      if (j < integer.size() - 1) {
        cout << ", ";
      }
    }
    cout << "}" << endl;
  } else if (dataType == 4) {
    // 4 byte real (NOT USED)
    cout << "Unsupported 4 byte real variable." << endl;
    return 1;
  } else if (dataType == 5) {
    // 8 byte real

    cout << ":{";
    cout.precision(12);
    for (unsigned int j = 0; j < B8Real.size(); j++) {
      cout << B8Real[j];
      if (j < B8Real.size() - 1) {
        cout << ", ";
      }
    }
    cout << "}" << endl;
  } else if (dataType == 6) {
    // ASCII string

    cout << ":{" << words << "}" << endl;
  } else {
    cout << "Smoke detected." << endl;
    return 1;
  }

  return 0;
}